

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  allocator local_51;
  string local_50;
  ScopedElement e;
  
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string((string *)&local_50,"OverallResults",&local_51);
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)&this->m_xml,(XmlFormatting)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"successes",&local_51);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_50,&(sectionStats->assertions).passed);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"failures",&local_51);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_50,&(sectionStats->assertions).failed);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"expectedFailures",&local_51);
    XmlWriter::writeAttribute<unsigned_long>
              (e.m_writer,&local_50,&(sectionStats->assertions).failedButOk);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      std::__cxx11::string::string((string *)&local_50,"durationInSeconds",&local_51);
      XmlWriter::writeAttribute<double>(e.m_writer,&local_50,&sectionStats->durationInSeconds);
      std::__cxx11::string::~string((string *)&local_50);
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }